

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
               (IntegerDecimalCastData<short> *state,int16_t exponent)

{
  StoreType *result;
  uint16_t uVar1;
  bool bVar2;
  long lVar3;
  short sVar4;
  long lVar5;
  long lVar6;
  
  sVar4 = exponent;
  if (exponent < 0) {
    lVar5 = state->result;
    if (state->result != 0) {
      do {
        lVar6 = lVar5;
        if (0xffffffffffffffec < lVar6 - 10U) break;
        bVar2 = exponent < -1;
        lVar5 = lVar6 / 10;
        exponent = exponent + 1;
      } while (bVar2);
      state->decimal = lVar6 % 10;
      state->result = lVar6 / 10;
    }
    if (state->decimal < 0) {
      state->decimal = -state->decimal;
    }
    state->decimal_digits = 1;
  }
  else {
    while ((state->result != 0 && (0 < sVar4))) {
      bVar2 = TryMultiplyOperator::Operation<long,long,long>(state->result,10,&state->result);
      sVar4 = sVar4 + -1;
      if (!bVar2) {
        return false;
      }
    }
    lVar5 = state->decimal;
    if (lVar5 != 0) {
      result = &state->decimal;
      uVar1 = state->decimal_digits;
      if ((short)(exponent - uVar1) < 0) {
        if ((ushort)(exponent - uVar1) < 0xffed) {
          lVar3 = 0;
          lVar5 = 0;
        }
        else {
          sVar4 = uVar1 - exponent;
          lVar6 = 1;
          do {
            lVar6 = lVar6 * 10;
            sVar4 = sVar4 + -1;
          } while (sVar4 != 0);
          lVar3 = lVar5 / lVar6;
          lVar5 = lVar5 % lVar6;
        }
        *result = lVar3;
      }
      else {
        sVar4 = (exponent - uVar1) + 1;
        lVar5 = 0;
        while (sVar4 = sVar4 + -1, 0 < sVar4) {
          bVar2 = TryMultiplyOperator::Operation<long,long,long>(*result,10,result);
          if (!bVar2) {
            return false;
          }
        }
      }
      state->decimal_digits = state->decimal_digits - exponent;
      bVar2 = TrySubtractOperator::Operation<long,long,long>
                        (state->result,state->decimal,&state->result);
      if (!bVar2) {
        return false;
      }
      *result = lVar5;
    }
  }
  bVar2 = Finalize<duckdb::IntegerDecimalCastData<short>,true>(state);
  return bVar2;
}

Assistant:

static bool HandleExponent(T &state, int16_t exponent) {
		using store_t = typename T::StoreType;

		int16_t e = exponent;
		// Negative Exponent
		if (e < 0) {
			while (state.result != 0 && e++ < 0) {
				state.decimal = state.result % 10;
				state.result /= 10;
			}
			if (state.decimal < 0) {
				state.decimal = -state.decimal;
			}
			state.decimal_digits = 1;
			return Finalize<T, NEGATIVE>(state);
		}

		// Positive Exponent
		while (state.result != 0 && e-- > 0) {
			if (!TryMultiplyOperator::Operation(state.result, (store_t)10, state.result)) {
				return false;
			}
		}

		if (state.decimal == 0) {
			return Finalize<T, NEGATIVE>(state);
		}

		// Handle decimals
		e = UnsafeNumericCast<int16_t>(exponent - state.decimal_digits);
		store_t remainder = 0;
		if (e < 0) {
			if (static_cast<uint16_t>(-e) <= NumericLimits<store_t>::Digits()) {
				store_t power = 1;
				while (e++ < 0) {
					power *= 10;
				}
				remainder = state.decimal % power;
				state.decimal /= power;
			} else {
				state.decimal = 0;
			}
		} else {
			while (e-- > 0) {
				if (!TryMultiplyOperator::Operation(state.decimal, (store_t)10, state.decimal)) {
					return false;
				}
			}
		}

		state.decimal_digits -= exponent;

		if (NEGATIVE) {
			if (!TrySubtractOperator::Operation(state.result, state.decimal, state.result)) {
				return false;
			}
		} else if (!TryAddOperator::Operation(state.result, state.decimal, state.result)) {
			return false;
		}
		state.decimal = remainder;
		return Finalize<T, NEGATIVE>(state);
	}